

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O2

lyd_node * lyd_parse_xml(ly_ctx *ctx,lyxml_elem **root,int options,...)

{
  LYS_NODE LVar1;
  lyxml_elem *plVar2;
  char in_AL;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  lyd_node *plVar6;
  lyd_node *plVar7;
  lyd_node *plVar8;
  lyd_node *in_RCX;
  char *pcVar9;
  lyd_node *plVar10;
  LY_ERR no;
  lyd_node **pplVar11;
  undefined8 in_R8;
  undefined8 in_R9;
  lyxml_elem *xml;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_158 [24];
  lyd_node *local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  lyd_node *local_a0;
  char *local_98;
  lyd_node *local_90;
  lyd_node *local_88;
  lyxml_elem **local_80;
  lyd_node *local_78;
  lyd_node *act_notif;
  ulong local_68;
  va_list ap;
  lyxml_elem *local_48;
  lyd_node *local_40;
  lyd_node *result;
  
  if (in_AL != '\0') {
    local_128 = in_XMM0_Qa;
    local_118 = in_XMM1_Qa;
    local_108 = in_XMM2_Qa;
    local_f8 = in_XMM3_Qa;
    local_e8 = in_XMM4_Qa;
    local_d8 = in_XMM5_Qa;
    local_c8 = in_XMM6_Qa;
    local_b8 = in_XMM7_Qa;
  }
  local_40 = (lyd_node *)0x0;
  local_78 = (lyd_node *)0x0;
  local_140 = in_RCX;
  local_138 = in_R8;
  local_130 = in_R9;
  if (ctx == (ly_ctx *)0x0 || root == (lyxml_elem **)0x0) {
    pcVar9 = "Invalid arguments (%s()).";
    no = LY_EINVAL;
    ctx = (ly_ctx *)0x0;
LAB_0013bcf8:
    ly_log(ctx,LY_LLERR,no,pcVar9,"lyd_parse_xml");
    return (lyd_node *)0x0;
  }
  iVar3 = lyp_data_check_options(ctx,options,"lyd_parse_xml");
  if (iVar3 != 0) {
    return (lyd_node *)0x0;
  }
  if (((options & 0x20U) == 0) && (*root == (lyxml_elem *)0x0)) {
    if ((options & 0x50U) == 0) {
      lyd_validate(&local_40,options,ctx);
      return local_40;
    }
    pcVar9 = "%s: *root identifies RPC/Notification so it cannot be NULL.";
    no = LY_EINVAL;
    goto LAB_0013bcf8;
  }
  act_notif = (lyd_node *)calloc(1,0x28);
  if (act_notif == (lyd_node *)0x0) {
    pcVar9 = "Memory allocation failed (%s()).";
    no = LY_EMEM;
    goto LAB_0013bcf8;
  }
  ap[0].overflow_arg_area = local_158;
  ap[0]._0_8_ = &stack0x00000008;
  local_68 = 0x3000000018;
  if ((options & 0x20U) != 0) {
    local_68 = 0x3000000020;
    if ((local_140 != (lyd_node *)0x0) && (local_140->parent == (lyd_node *)0x0)) {
      LVar1 = local_140->schema->nodetype;
      if ((LVar1 & (LYS_RPC|LYS_LIST|LYS_CONTAINER)) != LYS_UNKNOWN) {
        local_88 = local_140;
        local_80 = root;
        result = (lyd_node *)ctx;
        if (LVar1 != LYS_RPC) {
          plVar8 = lyd_dup(local_140,1);
          ctx = (ly_ctx *)result;
          plVar7 = plVar8;
          while (ap[0].reg_save_area = plVar7, plVar6 = (lyd_node *)ap[0].reg_save_area,
                ap[0].reg_save_area != (void *)0x0) {
            if (*(uint *)(*ap[0].reg_save_area + 0x38) == 0x4000) {
LAB_0013c2f9:
              lyd_free_withsiblings(*(lyd_node **)((long)plVar6 + 0x40));
              goto LAB_0013bd94;
            }
            if ((*(uint *)(*ap[0].reg_save_area + 0x38) & 0x802c) == 0) {
              plVar7 = *(lyd_node **)((long)ap[0].reg_save_area + 0x40);
              if (plVar7 != (lyd_node *)0x0) goto LAB_0013c1f5;
            }
            else {
              ap[0].reg_save_area = (void *)0x0;
              plVar7 = (lyd_node *)ap[0].reg_save_area;
            }
            ap[0].reg_save_area = plVar7;
            if (plVar6 == plVar8) goto LAB_0013c2f9;
            do {
              plVar7 = *(lyd_node **)((long)plVar6 + 0x18);
              ap[0].reg_save_area = plVar6;
LAB_0013c1f5:
            } while ((plVar7 == (lyd_node *)0x0) &&
                    (plVar6 = *(lyd_node **)((long)ap[0].reg_save_area + 0x28),
                    *(lyd_node **)((long)plVar6 + 0x28) != plVar8->parent));
          }
          local_48 = (lyxml_elem *)0x0;
          ly_log((ly_ctx *)result,LY_LLERR,LY_EINVAL,
                 "%s: invalid variable parameter (const struct lyd_node *rpc_act).","lyd_parse_xml")
          ;
          lyd_free_withsiblings(plVar8);
          goto LAB_0013c27b;
        }
        plVar6 = _lyd_new((lyd_node *)0x0,local_140->schema,0);
        plVar8 = plVar6;
        goto LAB_0013bd94;
      }
    }
    pcVar9 = "%s: invalid variable parameter (const struct lyd_node *rpc_act).";
    goto LAB_0013c18c;
  }
  local_80 = root;
  result = (lyd_node *)ctx;
  local_88 = (lyd_node *)0x0;
  plVar6 = (lyd_node *)0x0;
  plVar8 = (lyd_node *)0x0;
LAB_0013bd94:
  plVar4 = (long *)ap[0]._0_8_;
  if ((options & 0x70U) == 0) {
LAB_0013be7e:
    plVar10 = (lyd_node *)0x0;
  }
  else {
    if ((local_68 & 0xffffffff) < 0x29) {
      plVar4 = (long *)((local_68 & 0xffffffff) + (long)ap[0].overflow_arg_area);
      local_68 = CONCAT44(local_68._4_4_,(int)local_68 + 8);
    }
    else {
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    plVar7 = (lyd_node *)*plVar4;
    if (plVar7 == (lyd_node *)0x0) goto LAB_0013be7e;
    plVar10 = plVar7;
    ctx = (ly_ctx *)result;
    if ((short)options < 0) {
      pcVar9 = 
      "%s: invalid parameter (variable arg const struct lyd_node *data_tree and LYD_OPT_NOEXTDEPS set)."
      ;
LAB_0013c18c:
      local_48 = (lyxml_elem *)0x0;
      ly_log(ctx,LY_LLERR,LY_EINVAL,pcVar9,"lyd_parse_xml");
      goto LAB_0013c27b;
    }
    for (; plVar10 != (lyd_node *)0x0; plVar10 = plVar10->next) {
      if (plVar10->parent != (lyd_node *)0x0) {
        pcVar9 = "%s: invalid variable parameter (const struct lyd_node *data_tree).";
        ap[0].reg_save_area = plVar10;
        goto LAB_0013c18c;
      }
    }
    ap[0].reg_save_area = (void *)0x0;
    do {
      plVar10 = plVar7;
      plVar7 = plVar10->prev;
    } while (plVar10->prev->next != (lyd_node *)0x0);
    if (((uint)options >> 0xc & 1) != 0) {
      pcVar9 = 
      "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS)."
      ;
      goto LAB_0013c18c;
    }
  }
  puVar5 = (undefined8 *)ap[0]._0_8_;
  local_a0 = plVar10;
  if (((uint)options >> 0x18 & 1) == 0) {
    local_98 = (char *)0x0;
  }
  else {
    if ((local_68 & 0xffffffff) < 0x29) {
      puVar5 = (undefined8 *)((local_68 & 0xffffffff) + (long)ap[0].overflow_arg_area);
      local_68 = CONCAT44(local_68._4_4_,(int)local_68 + 8);
    }
    else {
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    local_98 = (char *)*puVar5;
  }
  xml = *local_80;
  local_90 = plVar8;
  if (((uint)options >> 0xc & 1) == 0 && xml != (lyxml_elem *)0x0) {
    plVar2 = xml;
    if (xml->parent == (lyxml_elem *)0x0) {
      do {
        xml = plVar2;
        plVar2 = xml->prev;
      } while (xml->prev->next != (lyxml_elem *)0x0);
    }
    else {
      xml = xml->parent->child;
    }
  }
  if (((((options & 0x10U) == 0) || (iVar3 = strcmp(xml->name,"action"), iVar3 != 0)) ||
      (iVar3 = strcmp(xml->ns->value,"urn:ietf:params:xml:ns:yang:1"), iVar3 != 0)) ||
     (xml = xml->child, ((uint)options >> 10 & 1) == 0)) {
    local_48 = (lyxml_elem *)0x0;
  }
  else {
    local_48 = xml->parent;
  }
  ap[0].reg_save_area = (void *)0x0;
  plVar8 = (lyd_node *)0x0;
  do {
    if (xml == (lyxml_elem *)0x0) break;
    plVar2 = xml->next;
    iVar3 = xml_parse_data((ly_ctx *)result,xml,plVar6,local_40,plVar8,options,
                           (unres_data *)act_notif,(lyd_node **)&ap[0].reg_save_area,&local_78,
                           local_98);
    if (iVar3 != 0) {
      ctx = (ly_ctx *)result;
      if (local_90 != (lyd_node *)0x0) {
        local_40 = local_90;
      }
      goto LAB_0013c27b;
    }
    if (((uint)options >> 10 & 1) != 0) {
      lyxml_free((ly_ctx *)result,xml);
      *local_80 = plVar2;
    }
    if (((ap[0].reg_save_area != (void *)0x0) &&
        (plVar8 = (lyd_node *)ap[0].reg_save_area, ((uint)options >> 0x11 & 1) != 0)) &&
       (*(long *)(*ap[0].reg_save_area + 0x30) ==
        *(long *)((long)result->child + (ulong)*(byte *)((long)&result[1].ht + 4) * 8 + -8))) {
      options = options & 0xfffdffff;
    }
    if (local_40 == (lyd_node *)0x0) {
      local_40 = (lyd_node *)ap[0].reg_save_area;
    }
    xml = plVar2;
  } while (((uint)options >> 0xc & 1) == 0);
  ctx = (ly_ctx *)result;
  if (local_90 != (lyd_node *)0x0) {
    local_40 = local_90;
  }
  plVar8 = local_40;
  if (((options & 0x20U) == 0) || (local_88->schema->nodetype == LYS_RPC)) {
    if (local_78 == (lyd_node *)0x0 && (options & 0x50U) != 0) {
      pcVar9 = "action";
      if ((options & 0x10U) == 0) {
        pcVar9 = "notification";
      }
      ly_vlog((ly_ctx *)result,LYE_INELEM,(uint)(local_40 != (lyd_node *)0x0) * 3,local_40,pcVar9);
      goto LAB_0013c27b;
    }
  }
  else {
    local_78 = plVar6;
  }
  plVar6 = local_78;
  if (((uint)options >> 0x11 & 1) != 0) {
    plVar7 = ly_ctx_info((ly_ctx *)result);
    if (plVar8 == (lyd_node *)0x0) {
      local_40 = plVar7;
    }
    else {
      iVar3 = lyd_merge(plVar8,plVar7,0x500);
      ctx = (ly_ctx *)result;
      if (iVar3 != 0) {
        ly_log((ly_ctx *)result,LY_LLERR,LY_EINT,"Adding ietf-yang-library data failed.");
        goto LAB_0013c27b;
      }
    }
  }
  pplVar11 = &local_40;
  while( true ) {
    ap[0].reg_save_area = *pplVar11;
    if ((lyd_node *)ap[0].reg_save_area == (lyd_node *)0x0) break;
    if ((((((lyd_node *)ap[0].reg_save_area)->schema->nodetype & (LYS_LIST|LYS_LEAFLIST)) !=
          LYS_UNKNOWN) && ((((lyd_node *)ap[0].reg_save_area)->validity & 1) != 0)) &&
       (iVar3 = lyv_data_dup((lyd_node *)ap[0].reg_save_area,local_40), ctx = (ly_ctx *)result,
       iVar3 != 0)) goto LAB_0013c27b;
    pplVar11 = (lyd_node **)((long)ap[0].reg_save_area + 0x18);
  }
  iVar3 = lyd_defaults_add_unres
                    (&local_40,options,(ly_ctx *)result,(lys_module **)0x0,0,local_a0,plVar6,
                     (unres_data *)act_notif,1);
  ctx = (ly_ctx *)result;
  if (iVar3 != 0) {
LAB_0013c27b:
    lyd_free_withsiblings(local_40);
    if (local_48 != (lyxml_elem *)0x0) {
      lyxml_free(ctx,local_48);
    }
    plVar6 = act_notif;
    free(act_notif->schema);
    free(*(void **)&plVar6->validity);
    free(plVar6);
    return (lyd_node *)0x0;
  }
  if ((options & 0x2080U) == 0) {
    plVar6 = local_78;
    if (local_78 == (lyd_node *)0x0) {
      plVar6 = local_40;
    }
    iVar3 = lyd_check_mandatory_tree(plVar6,(ly_ctx *)result,(lys_module **)0x0,0,options);
    if (iVar3 != 0) goto LAB_0013c27b;
  }
  if (local_48 != (lyxml_elem *)0x0) {
    lyxml_free(ctx,local_48);
  }
  plVar6 = act_notif;
  free(act_notif->schema);
  free(*(void **)&plVar6->validity);
  free(plVar6);
  return local_40;
}

Assistant:

lyd_node *
lyd_parse_xml(struct ly_ctx *ctx, struct lyxml_elem **root, int options, ...)
{
    va_list ap;
    int r;
    struct unres_data *unres = NULL;
    const struct lyd_node *rpc_act = NULL, *data_tree = NULL;
    struct lyd_node *result = NULL, *iter, *last, *reply_parent = NULL, *reply_top = NULL, *act_notif = NULL;
    struct lyxml_elem *xmlstart, *xmlelem, *xmlaux, *xmlfree = NULL;
    const char *yang_data_name = NULL;

    if (!ctx || !root) {
        LOGARG;
        return NULL;
    }

    if (lyp_data_check_options(ctx, options, __func__)) {
        return NULL;
    }

    if (!(*root) && !(options & LYD_OPT_RPCREPLY)) {
        /* empty tree */
        if (options & (LYD_OPT_RPC | LYD_OPT_NOTIF)) {
            /* error, top level node identify RPC and Notification */
            LOGERR(ctx, LY_EINVAL, "%s: *root identifies RPC/Notification so it cannot be NULL.", __func__);
            return NULL;
        } else if (!(options & LYD_OPT_RPCREPLY)) {
            /* others - no work is needed, just check for missing mandatory nodes */
            lyd_validate(&result, options, ctx);
            return result;
        }
        /* continue with empty RPC reply, for which we need RPC */
    }

    unres = calloc(1, sizeof *unres);
    LY_CHECK_ERR_RETURN(!unres, LOGMEM(ctx), NULL);

    va_start(ap, options);
    if (options & LYD_OPT_RPCREPLY) {
        rpc_act = va_arg(ap, const struct lyd_node *);
        if (!rpc_act || rpc_act->parent || !(rpc_act->schema->nodetype & (LYS_RPC | LYS_LIST | LYS_CONTAINER))) {
            LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *rpc_act).", __func__);
            goto error;
        }
        if (rpc_act->schema->nodetype == LYS_RPC) {
            /* RPC request */
            reply_top = reply_parent = _lyd_new(NULL, rpc_act->schema, 0);
        } else {
            /* action request */
            reply_top = lyd_dup(rpc_act, 1);
            LY_TREE_DFS_BEGIN(reply_top, iter, reply_parent) {
                if (reply_parent->schema->nodetype == LYS_ACTION) {
                    break;
                }
                LY_TREE_DFS_END(reply_top, iter, reply_parent);
            }
            if (!reply_parent) {
                LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *rpc_act).", __func__);
                lyd_free_withsiblings(reply_top);
                goto error;
            }
            lyd_free_withsiblings(reply_parent->child);
        }
    }
    if (options & (LYD_OPT_RPC | LYD_OPT_NOTIF | LYD_OPT_RPCREPLY)) {
        data_tree = va_arg(ap, const struct lyd_node *);
        if (data_tree) {
            if (options & LYD_OPT_NOEXTDEPS) {
                LOGERR(ctx, LY_EINVAL, "%s: invalid parameter (variable arg const struct lyd_node *data_tree and LYD_OPT_NOEXTDEPS set).",
                       __func__);
                goto error;
            }

            LY_TREE_FOR((struct lyd_node *)data_tree, iter) {
                if (iter->parent) {
                    /* a sibling is not top-level */
                    LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *data_tree).", __func__);
                    goto error;
                }
            }

            /* move it to the beginning */
            for (; data_tree->prev->next; data_tree = data_tree->prev);

            /* LYD_OPT_NOSIBLINGS cannot be set in this case */
            if (options & LYD_OPT_NOSIBLINGS) {
                LOGERR(ctx, LY_EINVAL, "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS).", __func__);
                goto error;
            }
        }
    }
    if (options & LYD_OPT_DATA_TEMPLATE) {
        yang_data_name = va_arg(ap, const char *);
    }

    if ((*root) && !(options & LYD_OPT_NOSIBLINGS)) {
        /* locate the first root to process */
        if ((*root)->parent) {
            xmlstart = (*root)->parent->child;
        } else {
            xmlstart = *root;
            while(xmlstart->prev->next) {
                xmlstart = xmlstart->prev;
            }
        }
    } else {
        xmlstart = *root;
    }

    if ((options & LYD_OPT_RPC)
            && !strcmp(xmlstart->name, "action") && !strcmp(xmlstart->ns->value, "urn:ietf:params:xml:ns:yang:1")) {
        /* it's an action, not a simple RPC */
        xmlstart = xmlstart->child;
        if (options & LYD_OPT_DESTRUCT) {
            /* free it later */
            xmlfree = xmlstart->parent;
        }
    }

    iter = last = NULL;
    LY_TREE_FOR_SAFE(xmlstart, xmlaux, xmlelem) {
        r = xml_parse_data(ctx, xmlelem, reply_parent, result, last, options, unres, &iter, &act_notif, yang_data_name);
        if (r) {
            if (reply_top) {
                result = reply_top;
            }
            goto error;
        } else if (options & LYD_OPT_DESTRUCT) {
            lyxml_free(ctx, xmlelem);
            *root = xmlaux;
        }
        if (iter) {
            last = iter;
            if ((options & LYD_OPT_DATA_ADD_YANGLIB) && iter->schema->module == ctx->models.list[ctx->internal_module_count - 1]) {
                /* ietf-yang-library data present, so ignore the option to add them */
                options &= ~LYD_OPT_DATA_ADD_YANGLIB;
            }
        }
        if (!result) {
            result = iter;
        }

        if (options & LYD_OPT_NOSIBLINGS) {
            /* stop after the first processed root */
            break;
        }
    }

    if (reply_top) {
        result = reply_top;
    }

    if ((options & LYD_OPT_RPCREPLY) && (rpc_act->schema->nodetype != LYS_RPC)) {
        /* action reply */
        act_notif = reply_parent;
    } else if ((options & (LYD_OPT_RPC | LYD_OPT_NOTIF)) && !act_notif) {
        LOGVAL(ctx, LYE_INELEM, (result ? LY_VLOG_LYD : LY_VLOG_NONE), result, (options & LYD_OPT_RPC ? "action" : "notification"));
        goto error;
    }

    /* add missing ietf-yang-library if requested */
    if (options & LYD_OPT_DATA_ADD_YANGLIB) {
        if (!result) {
            result = ly_ctx_info(ctx);
        } else if (lyd_merge(result, ly_ctx_info(ctx), LYD_OPT_DESTRUCT | LYD_OPT_EXPLICIT)) {
            LOGERR(ctx, LY_EINT, "Adding ietf-yang-library data failed.");
            goto error;
        }
    }

    /* check for uniqueness of top-level lists/leaflists because
     * only the inner instances were tested in lyv_data_content() */
    LY_TREE_FOR(result, iter) {
        if (!(iter->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) || !(iter->validity & LYD_VAL_DUP)) {
            continue;
        }

        if (lyv_data_dup(iter, result)) {
            goto error;
        }
    }

    /* add default values, resolve unres and check for mandatory nodes in final tree */
    if (lyd_defaults_add_unres(&result, options, ctx, NULL, 0, data_tree, act_notif, unres, 1)) {
        goto error;
    }
    if (!(options & (LYD_OPT_TRUSTED | LYD_OPT_NOTIF_FILTER))
            && lyd_check_mandatory_tree((act_notif ? act_notif : result), ctx, NULL, 0, options)) {
        goto error;
    }

    if (xmlfree) {
        lyxml_free(ctx, xmlfree);
    }
    free(unres->node);
    free(unres->type);
    free(unres);
    va_end(ap);
    return result;

error:
    lyd_free_withsiblings(result);
    if (xmlfree) {
        lyxml_free(ctx, xmlfree);
    }
    free(unres->node);
    free(unres->type);
    free(unres);
    va_end(ap);
    return NULL;
}